

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O1

AABox * __thiscall Triangle::boundingVolume(AABox *__return_storage_ptr__,Triangle *this)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  vec3f *pvVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  fVar21 = (this->v2).x;
  fVar1 = (this->v1).x;
  fVar7 = (this->v1).x;
  fVar8 = (this->v1).y;
  fVar22 = (this->v3).x;
  fVar9 = (this->v3).y;
  fVar2 = (this->v3).z;
  uVar3 = (this->v1).y;
  uVar5 = (this->v1).z;
  fVar10 = (this->v2).y;
  fVar11 = (this->v2).z;
  fVar12 = (this->v3).x;
  fVar13 = (this->v3).y;
  fVar19 = fVar12;
  if (fVar21 <= fVar12) {
    fVar19 = fVar21;
  }
  if (fVar1 <= fVar19) {
    fVar19 = fVar1;
  }
  uVar4 = (this->v2).x;
  uVar6 = (this->v2).y;
  __return_storage_ptr__->x1 = fVar19;
  fVar19 = (float)(~-(uint)(fVar13 < fVar10) & (uint)fVar10 |
                  (uint)fVar13 & -(uint)(fVar13 < fVar10));
  fVar20 = (float)(~-(uint)(fVar2 < fVar11) & (uint)fVar11 | (uint)fVar2 & -(uint)(fVar2 < fVar11));
  fVar21 = (float)(~-(uint)(fVar21 < fVar12) & uVar4 | (uint)fVar22 & -(uint)(fVar21 < fVar12));
  fVar22 = (float)(~-(uint)(fVar10 < fVar13) & uVar6 | (uint)fVar9 & -(uint)(fVar10 < fVar13));
  uVar15 = -(uint)(fVar1 < fVar21);
  uVar16 = -(uint)(fVar19 < fVar8);
  uVar17 = -(uint)(fVar8 < fVar22);
  uVar18 = -(uint)(fVar20 < (float)uVar5);
  __return_storage_ptr__->x2 = (float)(~uVar15 & (uint)fVar7 | (uint)fVar21 & uVar15);
  __return_storage_ptr__->y1 = (float)(~uVar16 & (uint)fVar8 | (uint)fVar19 & uVar16);
  __return_storage_ptr__->y2 = (float)(~uVar17 & uVar3 | (uint)fVar22 & uVar17);
  __return_storage_ptr__->z1 = (float)(~uVar18 & uVar5 | (uint)fVar20 & uVar18);
  pvVar14 = &this->v2;
  if (fVar11 < fVar2) {
    pvVar14 = &this->v3;
  }
  uVar15 = -(uint)((float)uVar5 < pvVar14->z);
  __return_storage_ptr__->z2 = (float)(~uVar15 & (uint)(this->v1).z | (uint)pvVar14->z & uVar15);
  return __return_storage_ptr__;
}

Assistant:

AABox boundingVolume() const
	{
		AABox v;
		v.x1 = std::min(v1.x, std::min(v2.x, v3.x));
		v.x2 = std::max(v1.x, std::max(v2.x, v3.x));
		v.y1 = std::min(v1.y, std::min(v2.y, v3.y));
		v.y2 = std::max(v1.y, std::max(v2.y, v3.y));
		v.z1 = std::min(v1.z, std::min(v2.z, v3.z));
		v.z2 = std::max(v1.z, std::max(v2.z, v3.z));
		return v;
	}